

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void identPut(char *z,int *pIdx,char *zSignedIdent)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  int id;
  int local_34;
  
  uVar3 = (ulong)(byte)*zSignedIdent;
  uVar6 = 0;
  bVar8 = uVar3 != 0;
  if ((bVar8) && ((uVar3 == 0x5f || ((""[uVar3] & 6) != 0)))) {
    uVar6 = 0;
    do {
      uVar3 = (ulong)(byte)zSignedIdent[uVar6 + 1];
      bVar8 = uVar3 != 0;
      if (uVar3 == 0) {
        uVar6 = (ulong)((int)uVar6 + 1);
        break;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar3 == 0x5f) || ((""[uVar3] & 6) != 0));
  }
  iVar5 = *pIdx;
  bVar1 = true;
  if ((ulong)(byte)*zSignedIdent - 0x3a < 0xfffffffffffffff6) {
    local_34 = 0x3b;
    keywordCode(zSignedIdent,(int)uVar6,&local_34);
    bVar1 = true;
    if (local_34 == 0x3b) {
      bVar1 = (bool)((int)uVar6 == 0 | bVar8);
    }
  }
  if (bVar1) {
    lVar2 = (long)iVar5;
    iVar5 = iVar5 + 1;
    z[lVar2] = '\"';
  }
  cVar4 = *zSignedIdent;
  if (cVar4 != '\0') {
    pcVar7 = zSignedIdent + 1;
    do {
      z[iVar5] = cVar4;
      uVar3 = (long)iVar5 + 1;
      if (pcVar7[-1] == '\"') {
        z[uVar3] = '\"';
        uVar3 = (ulong)(iVar5 + 2);
      }
      cVar4 = *pcVar7;
      pcVar7 = pcVar7 + 1;
      iVar5 = (int)uVar3;
    } while (cVar4 != '\0');
  }
  if (bVar1) {
    lVar2 = (long)iVar5;
    iVar5 = iVar5 + 1;
    z[lVar2] = '\"';
  }
  z[iVar5] = '\0';
  *pIdx = iVar5;
  return;
}

Assistant:

static void identPut(char *z, int *pIdx, char *zSignedIdent){
  unsigned char *zIdent = (unsigned char*)zSignedIdent;
  int i, j, needQuote;
  i = *pIdx;

  for(j=0; zIdent[j]; j++){
    if( !sqlite3Isalnum(zIdent[j]) && zIdent[j]!='_' ) break;
  }
  needQuote = sqlite3Isdigit(zIdent[0])
            || sqlite3KeywordCode(zIdent, j)!=TK_ID
            || zIdent[j]!=0
            || j==0;

  if( needQuote ) z[i++] = '"';
  for(j=0; zIdent[j]; j++){
    z[i++] = zIdent[j];
    if( zIdent[j]=='"' ) z[i++] = '"';
  }
  if( needQuote ) z[i++] = '"';
  z[i] = 0;
  *pIdx = i;
}